

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::begin_query(NegativeTestContext *ctx)

{
  allocator<char> local_3d;
  GLuint ids [3];
  string local_30;
  
  glu::CallLogWrapper::glGenQueries(&ctx->super_CallLogWrapper,3,ids);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_ENUM is generated if target is not one of the accepted tokens.",&local_3d);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glBeginQuery(&ctx->super_CallLogWrapper,0xffffffff,ids[0]);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_OPERATION is generated if ctx.glBeginQuery is executed while a query object of the same target is already active."
             ,&local_3d);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glBeginQuery(&ctx->super_CallLogWrapper,0x8c2f,ids[0]);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glBeginQuery(&ctx->super_CallLogWrapper,0x8c2f,ids[1]);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBeginQuery(&ctx->super_CallLogWrapper,0x8d6a,ids[1]);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBeginQuery(&ctx->super_CallLogWrapper,0x8c88,ids[1]);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glBeginQuery(&ctx->super_CallLogWrapper,0x8c88,ids[2]);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glEndQuery(&ctx->super_CallLogWrapper,0x8c2f);
  glu::CallLogWrapper::glEndQuery(&ctx->super_CallLogWrapper,0x8c88);
  NegativeTestContext::expectError(ctx,0);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_INVALID_OPERATION is generated if id is 0.",&local_3d);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glBeginQuery(&ctx->super_CallLogWrapper,0x8c2f,0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_OPERATION is generated if id not a name returned from a previous call to ctx.glGenQueries, or if such a name has since been deleted with ctx.glDeleteQueries."
             ,&local_3d);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glBeginQuery(&ctx->super_CallLogWrapper,0x8c2f,0xffffffff);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glDeleteQueries(&ctx->super_CallLogWrapper,1,ids + 2);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glBeginQuery(&ctx->super_CallLogWrapper,0x8c2f,ids[2]);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_OPERATION is generated if id is the name of an already active query object."
             ,&local_3d);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glBeginQuery(&ctx->super_CallLogWrapper,0x8c2f,ids[0]);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glBeginQuery(&ctx->super_CallLogWrapper,0x8c88,ids[0]);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_OPERATION is generated if id refers to an existing query object whose type does not does not match target."
             ,&local_3d);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glEndQuery(&ctx->super_CallLogWrapper,0x8c2f);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glBeginQuery(&ctx->super_CallLogWrapper,0x8c88,ids[0]);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteQueries(&ctx->super_CallLogWrapper,2,ids);
  NegativeTestContext::expectError(ctx,0);
  return;
}

Assistant:

void begin_query (NegativeTestContext& ctx)
{
	GLuint ids[3];
	ctx.glGenQueries	(3, ids);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not one of the accepted tokens.");
	ctx.glBeginQuery	(-1, ids[0]);
	ctx.expectError		(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if ctx.glBeginQuery is executed while a query object of the same target is already active.");
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED, ids[0]);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED, ids[1]);
	ctx.expectError		(GL_INVALID_OPERATION);
	// \note GL_ANY_SAMPLES_PASSED and GL_ANY_SAMPLES_PASSED_CONSERVATIVE alias to the same target for the purposes of this error.
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED_CONSERVATIVE, ids[1]);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glBeginQuery	(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, ids[1]);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glBeginQuery	(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, ids[2]);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glEndQuery		(GL_ANY_SAMPLES_PASSED);
	ctx.glEndQuery		(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);
	ctx.expectError		(GL_NO_ERROR);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if id is 0.");
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED, 0);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if id not a name returned from a previous call to ctx.glGenQueries, or if such a name has since been deleted with ctx.glDeleteQueries.");
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED, -1);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glDeleteQueries	(1, &ids[2]);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED, ids[2]);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if id is the name of an already active query object.");
	ctx.glBeginQuery	(GL_ANY_SAMPLES_PASSED, ids[0]);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glBeginQuery	(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, ids[0]);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if id refers to an existing query object whose type does not does not match target.");
	ctx.glEndQuery		(GL_ANY_SAMPLES_PASSED);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glBeginQuery	(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, ids[0]);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteQueries	(2, &ids[0]);
	ctx.expectError		(GL_NO_ERROR);
}